

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

void google::protobuf::internal::TcParser::WriteLengthDelimitedToUnknown<std::__cxx11::string>
               (MessageLite *msg,int number,string_view value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *in_R8;
  string_view val;
  
  pbVar1 = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(&msg->_internal_metadata_)
  ;
  val._M_str = (char *)pbVar1;
  val._M_len = (size_t)value._M_str;
  WriteLengthDelimited((internal *)(ulong)(uint)number,(uint32_t)value._M_len,val,in_R8);
  return;
}

Assistant:

static void WriteLengthDelimitedToUnknown(MessageLite* msg, int number,
                                            absl::string_view value) {
    internal::WriteLengthDelimited(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }